

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu541.c
# Opt level: O0

void vepu540_h265_set_l2_regs(H265eV54xL2RegSet *reg)

{
  H265eV54xL2RegSet *reg_local;
  
  reg->pre_intra_cla0_B0 =
       (anon_struct_4_6_2c359818_for_pre_intra_cla0_B0)
       ((uint)reg->pre_intra_cla0_B0 & 0xffffffc0 | 10);
  reg->pre_intra_cla0_B0 =
       (anon_struct_4_6_2c359818_for_pre_intra_cla0_B0)
       ((uint)reg->pre_intra_cla0_B0 & 0xfffff03f | 0x2c0);
  reg->pre_intra_cla0_B0 =
       (anon_struct_4_6_2c359818_for_pre_intra_cla0_B0)
       ((uint)reg->pre_intra_cla0_B0 & 0xfffc0fff | 0xc000);
  reg->pre_intra_cla0_B0 =
       (anon_struct_4_6_2c359818_for_pre_intra_cla0_B0)
       ((uint)reg->pre_intra_cla0_B0 & 0xff03ffff | 0x340000);
  reg->pre_intra_cla0_B0 =
       (anon_struct_4_6_2c359818_for_pre_intra_cla0_B0)
       ((uint)reg->pre_intra_cla0_B0 & 0xc0ffffff | 0xe000000);
  reg->pre_intra_cla0_B1 =
       (anon_struct_4_6_3506a1f3_for_pre_intra_cla0_B1)
       ((uint)reg->pre_intra_cla0_B1 & 0xffffffc0 | 9);
  reg->pre_intra_cla0_B1 =
       (anon_struct_4_6_3506a1f3_for_pre_intra_cla0_B1)
       ((uint)reg->pre_intra_cla0_B1 & 0xfffff03f | 0x3c0);
  reg->pre_intra_cla0_B1 =
       (anon_struct_4_6_3506a1f3_for_pre_intra_cla0_B1)
       ((uint)reg->pre_intra_cla0_B1 & 0xfffc0fff | 0x8000);
  reg->pre_intra_cla0_B1 =
       (anon_struct_4_6_3506a1f3_for_pre_intra_cla0_B1)
       ((uint)reg->pre_intra_cla0_B1 & 0xff03ffff | 0x400000);
  reg->pre_intra_cla0_B1 =
       (anon_struct_4_6_3506a1f3_for_pre_intra_cla0_B1)
       ((uint)reg->pre_intra_cla0_B1 & 0xc0ffffff | 0x7000000);
  reg->pre_intra_cla1_B0 =
       (anon_struct_4_6_5f045f59_for_pre_intra_cla1_B0)
       ((uint)reg->pre_intra_cla1_B0 & 0xffffffc0 | 10);
  reg->pre_intra_cla1_B0 =
       (anon_struct_4_6_5f045f59_for_pre_intra_cla1_B0)
       ((uint)reg->pre_intra_cla1_B0 & 0xfffff03f | 0x240);
  reg->pre_intra_cla1_B0 =
       (anon_struct_4_6_5f045f59_for_pre_intra_cla1_B0)
       ((uint)reg->pre_intra_cla1_B0 & 0xfffc0fff | 0x8000);
  reg->pre_intra_cla1_B0 =
       (anon_struct_4_6_5f045f59_for_pre_intra_cla1_B0)
       ((uint)reg->pre_intra_cla1_B0 & 0xff03ffff | 0x1c0000);
  reg->pre_intra_cla1_B0 =
       (anon_struct_4_6_5f045f59_for_pre_intra_cla1_B0)
       ((uint)reg->pre_intra_cla1_B0 & 0xc0ffffff | 0x6000000);
  reg->pre_intra_cla1_B1 =
       (anon_struct_4_6_67d56934_for_pre_intra_cla1_B1)
       ((uint)reg->pre_intra_cla1_B1 & 0xffffffc0 | 0xb);
  reg->pre_intra_cla1_B1 =
       (anon_struct_4_6_67d56934_for_pre_intra_cla1_B1)
       ((uint)reg->pre_intra_cla1_B1 & 0xfffff03f | 0x140);
  reg->pre_intra_cla1_B1 =
       (anon_struct_4_6_67d56934_for_pre_intra_cla1_B1)
       ((uint)reg->pre_intra_cla1_B1 & 0xfffc0fff | 0xc000);
  reg->pre_intra_cla1_B1 =
       (anon_struct_4_6_67d56934_for_pre_intra_cla1_B1)
       ((uint)reg->pre_intra_cla1_B1 & 0xff03ffff | 0x100000);
  reg->pre_intra_cla1_B1 =
       (anon_struct_4_6_67d56934_for_pre_intra_cla1_B1)
       ((uint)reg->pre_intra_cla1_B1 & 0xc0ffffff | 0xd000000);
  reg->pre_intra_cla2_B0 =
       (anon_struct_4_6_91d3269a_for_pre_intra_cla2_B0)
       ((uint)reg->pre_intra_cla2_B0 & 0xffffffc0 | 0x12);
  reg->pre_intra_cla2_B0 =
       (anon_struct_4_6_91d3269a_for_pre_intra_cla2_B0)
       ((uint)reg->pre_intra_cla2_B0 & 0xfffff03f | 0x440);
  reg->pre_intra_cla2_B0 =
       (anon_struct_4_6_91d3269a_for_pre_intra_cla2_B0)
       ((uint)reg->pre_intra_cla2_B0 & 0xfffc0fff | 0x10000);
  reg->pre_intra_cla2_B0 =
       (anon_struct_4_6_91d3269a_for_pre_intra_cla2_B0)
       ((uint)reg->pre_intra_cla2_B0 & 0xff03ffff | 0x3c0000);
  reg->pre_intra_cla2_B0 =
       (anon_struct_4_6_91d3269a_for_pre_intra_cla2_B0)
       ((uint)reg->pre_intra_cla2_B0 & 0xc0ffffff | 0xe000000);
  reg->pre_intra_cla2_B1 =
       (anon_struct_4_6_9aa43075_for_pre_intra_cla2_B1)
       ((uint)reg->pre_intra_cla2_B1 & 0xffffffc0 | 0x13);
  reg->pre_intra_cla2_B1 =
       (anon_struct_4_6_9aa43075_for_pre_intra_cla2_B1)
       ((uint)reg->pre_intra_cla2_B1 & 0xfffff03f | 0x340);
  reg->pre_intra_cla2_B1 =
       (anon_struct_4_6_9aa43075_for_pre_intra_cla2_B1)
       ((uint)reg->pre_intra_cla2_B1 & 0xfffc0fff | 0x14000);
  reg->pre_intra_cla2_B1 =
       (anon_struct_4_6_9aa43075_for_pre_intra_cla2_B1)
       ((uint)reg->pre_intra_cla2_B1 & 0xff03ffff | 0x300000);
  reg->pre_intra_cla2_B1 =
       (anon_struct_4_6_9aa43075_for_pre_intra_cla2_B1)
       ((uint)reg->pre_intra_cla2_B1 & 0xc0ffffff | 0x15000000);
  reg->pre_intra_cla3_B0 =
       (anon_struct_4_6_c4a1eddb_for_pre_intra_cla3_B0)
       ((uint)reg->pre_intra_cla3_B0 & 0xffffffc0 | 0x12);
  reg->pre_intra_cla3_B0 =
       (anon_struct_4_6_c4a1eddb_for_pre_intra_cla3_B0)
       ((uint)reg->pre_intra_cla3_B0 & 0xfffff03f | 0x4c0);
  reg->pre_intra_cla3_B0 =
       (anon_struct_4_6_c4a1eddb_for_pre_intra_cla3_B0)
       ((uint)reg->pre_intra_cla3_B0 & 0xfffc0fff | 0x14000);
  reg->pre_intra_cla3_B0 =
       (anon_struct_4_6_c4a1eddb_for_pre_intra_cla3_B0)
       ((uint)reg->pre_intra_cla3_B0 & 0xff03ffff | 0x540000);
  reg->pre_intra_cla3_B0 =
       (anon_struct_4_6_c4a1eddb_for_pre_intra_cla3_B0)
       ((uint)reg->pre_intra_cla3_B0 & 0xc0ffffff | 0x16000000);
  reg->pre_intra_cla3_B1 =
       (anon_struct_4_6_cd72f7b6_for_pre_intra_cla3_B1)
       ((uint)reg->pre_intra_cla3_B1 & 0xffffffc0 | 0x11);
  reg->pre_intra_cla3_B1 =
       (anon_struct_4_6_cd72f7b6_for_pre_intra_cla3_B1)
       ((uint)reg->pre_intra_cla3_B1 & 0xfffff03f | 0x5c0);
  reg->pre_intra_cla3_B1 =
       (anon_struct_4_6_cd72f7b6_for_pre_intra_cla3_B1)
       ((uint)reg->pre_intra_cla3_B1 & 0xfffc0fff | 0x10000);
  reg->pre_intra_cla3_B1 =
       (anon_struct_4_6_cd72f7b6_for_pre_intra_cla3_B1)
       ((uint)reg->pre_intra_cla3_B1 & 0xff03ffff | 0x600000);
  reg->pre_intra_cla3_B1 =
       (anon_struct_4_6_cd72f7b6_for_pre_intra_cla3_B1)
       ((uint)reg->pre_intra_cla3_B1 & 0xc0ffffff | 0xf000000);
  reg->pre_intra_cla4_B0 =
       (anon_struct_4_6_f770b51c_for_pre_intra_cla4_B0)
       ((uint)reg->pre_intra_cla4_B0 & 0xffffffc0 | 0x19);
  reg->pre_intra_cla4_B0 =
       (anon_struct_4_6_f770b51c_for_pre_intra_cla4_B0)
       ((uint)reg->pre_intra_cla4_B0 & 0xfffff03f | 0x680);
  reg->pre_intra_cla4_B0 =
       (anon_struct_4_6_f770b51c_for_pre_intra_cla4_B0)
       ((uint)reg->pre_intra_cla4_B0 & 0xfffc0fff | 0x18000);
  reg->pre_intra_cla4_B0 =
       (anon_struct_4_6_f770b51c_for_pre_intra_cla4_B0)
       ((uint)reg->pre_intra_cla4_B0 & 0xff03ffff | 0x5c0000);
  reg->pre_intra_cla4_B0 =
       (anon_struct_4_6_f770b51c_for_pre_intra_cla4_B0)
       ((uint)reg->pre_intra_cla4_B0 & 0xc0ffffff | 0x16000000);
  reg->pre_intra_cla4_B1 =
       (anon_struct_4_6_0041bef7_for_pre_intra_cla4_B1)
       ((uint)reg->pre_intra_cla4_B1 & 0xffffffc0 | 0x1b);
  reg->pre_intra_cla4_B1 =
       (anon_struct_4_6_0041bef7_for_pre_intra_cla4_B1)
       ((uint)reg->pre_intra_cla4_B1 & 0xfffff03f | 0x540);
  reg->pre_intra_cla4_B1 =
       (anon_struct_4_6_0041bef7_for_pre_intra_cla4_B1)
       ((uint)reg->pre_intra_cla4_B1 & 0xfffc0fff | 0x1c000);
  reg->pre_intra_cla4_B1 =
       (anon_struct_4_6_0041bef7_for_pre_intra_cla4_B1)
       ((uint)reg->pre_intra_cla4_B1 & 0xff03ffff | 0x500000);
  reg->pre_intra_cla4_B1 =
       (anon_struct_4_6_0041bef7_for_pre_intra_cla4_B1)
       ((uint)reg->pre_intra_cla4_B1 & 0xc0ffffff | 0x1d000000);
  reg->pre_intra_cla5_B0 =
       (anon_struct_4_6_2a3f7c5d_for_pre_intra_cla5_B0)
       ((uint)reg->pre_intra_cla5_B0 & 0xffffffc0 | 0x1b);
  reg->pre_intra_cla5_B0 =
       (anon_struct_4_6_2a3f7c5d_for_pre_intra_cla5_B0)
       ((uint)reg->pre_intra_cla5_B0 & 0xfffff03f | 0x680);
  reg->pre_intra_cla5_B0 =
       (anon_struct_4_6_2a3f7c5d_for_pre_intra_cla5_B0)
       ((uint)reg->pre_intra_cla5_B0 & 0xfffc0fff | 0x1c000);
  reg->pre_intra_cla5_B0 =
       (anon_struct_4_6_2a3f7c5d_for_pre_intra_cla5_B0)
       ((uint)reg->pre_intra_cla5_B0 & 0xff03ffff | 0x740000);
  reg->pre_intra_cla5_B0 =
       (anon_struct_4_6_2a3f7c5d_for_pre_intra_cla5_B0)
       ((uint)reg->pre_intra_cla5_B0 & 0xc0ffffff | 0x1e000000);
  reg->pre_intra_cla5_B1 =
       (anon_struct_4_6_33108638_for_pre_intra_cla5_B1)
       ((uint)reg->pre_intra_cla5_B1 & 0xffffffc0 | 0x19);
  reg->pre_intra_cla5_B1 =
       (anon_struct_4_6_33108638_for_pre_intra_cla5_B1)
       ((uint)reg->pre_intra_cla5_B1 & 0xfffff03f | 0x7c0);
  reg->pre_intra_cla5_B1 =
       (anon_struct_4_6_33108638_for_pre_intra_cla5_B1)
       ((uint)reg->pre_intra_cla5_B1 & 0xfffc0fff | 0x18000);
  reg->pre_intra_cla5_B1 =
       (anon_struct_4_6_33108638_for_pre_intra_cla5_B1)
       ((uint)reg->pre_intra_cla5_B1 & 0xff03ffff | 0x800000);
  reg->pre_intra_cla5_B1 =
       (anon_struct_4_6_33108638_for_pre_intra_cla5_B1)
       ((uint)reg->pre_intra_cla5_B1 & 0xc0ffffff | 0x17000000);
  reg->pre_intra_cla6_B0 =
       (anon_struct_4_6_5d0e439e_for_pre_intra_cla6_B0)
       ((uint)reg->pre_intra_cla6_B0 & 0xffffffc0 | 0x22);
  reg->pre_intra_cla6_B0 =
       (anon_struct_4_6_5d0e439e_for_pre_intra_cla6_B0)
       ((uint)reg->pre_intra_cla6_B0 & 0xfffff03f | 0x840);
  reg->pre_intra_cla6_B0 =
       (anon_struct_4_6_5d0e439e_for_pre_intra_cla6_B0)
       ((uint)reg->pre_intra_cla6_B0 & 0xfffc0fff | 0x20000);
  reg->pre_intra_cla6_B0 =
       (anon_struct_4_6_5d0e439e_for_pre_intra_cla6_B0)
       ((uint)reg->pre_intra_cla6_B0 & 0xff03ffff | 0x7c0000);
  reg->pre_intra_cla6_B0 =
       (anon_struct_4_6_5d0e439e_for_pre_intra_cla6_B0)
       ((uint)reg->pre_intra_cla6_B0 & 0xc0ffffff | 0x1e000000);
  reg->pre_intra_cla6_B1 =
       (anon_struct_4_6_65df4d79_for_pre_intra_cla6_B1)
       ((uint)reg->pre_intra_cla6_B1 & 0xffffffc0 | 2);
  reg->pre_intra_cla6_B1 =
       (anon_struct_4_6_65df4d79_for_pre_intra_cla6_B1)
       ((uint)reg->pre_intra_cla6_B1 & 0xfffff03f | 0x740);
  reg->pre_intra_cla6_B1 =
       (anon_struct_4_6_65df4d79_for_pre_intra_cla6_B1)
       ((uint)reg->pre_intra_cla6_B1 & 0xfffc0fff | 0x3000);
  reg->pre_intra_cla6_B1 =
       (anon_struct_4_6_65df4d79_for_pre_intra_cla6_B1)
       ((uint)reg->pre_intra_cla6_B1 & 0xff03ffff | 0x700000);
  reg->pre_intra_cla6_B1 =
       (anon_struct_4_6_65df4d79_for_pre_intra_cla6_B1)
       ((uint)reg->pre_intra_cla6_B1 & 0xc0ffffff | 0x4000000);
  reg->pre_intra_cla7_B0 =
       (anon_struct_4_6_8fdd0adf_for_pre_intra_cla7_B0)
       ((uint)reg->pre_intra_cla7_B0 & 0xffffffc0 | 0x22);
  reg->pre_intra_cla7_B0 =
       (anon_struct_4_6_8fdd0adf_for_pre_intra_cla7_B0)
       ((uint)reg->pre_intra_cla7_B0 & 0xfffff03f | 0x80);
  reg->pre_intra_cla7_B0 =
       (anon_struct_4_6_8fdd0adf_for_pre_intra_cla7_B0)
       ((uint)reg->pre_intra_cla7_B0 & 0xfffc0fff | 0x3000);
  reg->pre_intra_cla7_B0 =
       (anon_struct_4_6_8fdd0adf_for_pre_intra_cla7_B0)
       ((uint)reg->pre_intra_cla7_B0 & 0xff03ffff | 0x100000);
  reg->pre_intra_cla7_B0 =
       (anon_struct_4_6_8fdd0adf_for_pre_intra_cla7_B0)
       ((uint)reg->pre_intra_cla7_B0 & 0xc0ffffff | 0x5000000);
  reg->pre_intra_cla7_B1 =
       (anon_struct_4_6_98ae14ba_for_pre_intra_cla7_B1)
       ((uint)reg->pre_intra_cla7_B1 & 0xffffffc0 | 0x21);
  reg->pre_intra_cla7_B1 =
       (anon_struct_4_6_98ae14ba_for_pre_intra_cla7_B1)
       ((uint)reg->pre_intra_cla7_B1 & 0xfffff03f | 0x180);
  reg->pre_intra_cla7_B1 =
       (anon_struct_4_6_98ae14ba_for_pre_intra_cla7_B1)
       ((uint)reg->pre_intra_cla7_B1 & 0xfffc0fff | 0x20000);
  reg->pre_intra_cla7_B1 =
       (anon_struct_4_6_98ae14ba_for_pre_intra_cla7_B1)
       ((uint)reg->pre_intra_cla7_B1 & 0xff03ffff | 0x1c0000);
  reg->pre_intra_cla7_B1 =
       (anon_struct_4_6_98ae14ba_for_pre_intra_cla7_B1)
       ((uint)reg->pre_intra_cla7_B1 & 0xc0ffffff | 0x1f000000);
  reg->pre_intra_cla8_B0 =
       (anon_struct_4_6_c2abd220_for_pre_intra_cla8_B0)
       ((uint)reg->pre_intra_cla8_B0 & 0xffffffc0 | 10);
  reg->pre_intra_cla8_B0 =
       (anon_struct_4_6_c2abd220_for_pre_intra_cla8_B0)
       ((uint)reg->pre_intra_cla8_B0 & 0xfffff03f | 0x680);
  reg->pre_intra_cla8_B0 =
       (anon_struct_4_6_c2abd220_for_pre_intra_cla8_B0)
       ((uint)reg->pre_intra_cla8_B0 & 0xfffc0fff | 0x12000);
  reg->pre_intra_cla8_B0 =
       (anon_struct_4_6_c2abd220_for_pre_intra_cla8_B0)
       ((uint)reg->pre_intra_cla8_B0 & 0xff03ffff | 0x880000);
  reg->pre_intra_cla8_B0 =
       (anon_struct_4_6_c2abd220_for_pre_intra_cla8_B0)
       ((uint)reg->pre_intra_cla8_B0 & 0xc0ffffff | 0x6000000);
  reg->pre_intra_cla8_B1 =
       (anon_struct_4_6_cb7cdbfb_for_pre_intra_cla8_B1)
       ((uint)reg->pre_intra_cla8_B1 & 0xffffffc0 | 0xe);
  reg->pre_intra_cla8_B1 =
       (anon_struct_4_6_cb7cdbfb_for_pre_intra_cla8_B1)
       ((uint)reg->pre_intra_cla8_B1 & 0xfffff03f | 0x580);
  reg->pre_intra_cla8_B1 =
       (anon_struct_4_6_cb7cdbfb_for_pre_intra_cla8_B1)
       ((uint)reg->pre_intra_cla8_B1 & 0xfffc0fff | 0x1e000);
  reg->pre_intra_cla8_B1 =
       (anon_struct_4_6_cb7cdbfb_for_pre_intra_cla8_B1)
       ((uint)reg->pre_intra_cla8_B1 & 0xff03ffff | 0x80000);
  reg->pre_intra_cla8_B1 =
       (anon_struct_4_6_cb7cdbfb_for_pre_intra_cla8_B1)
       ((uint)reg->pre_intra_cla8_B1 & 0xc0ffffff | 0x18000000);
  reg->pre_intra_cla9_B0 =
       (anon_struct_4_6_f57a9961_for_pre_intra_cla9_B0)((uint)reg->pre_intra_cla9_B0 & 0xffffffc0);
  reg->pre_intra_cla9_B0 =
       (anon_struct_4_6_f57a9961_for_pre_intra_cla9_B0)((uint)reg->pre_intra_cla9_B0 & 0xfffff03f);
  reg->pre_intra_cla9_B0 =
       (anon_struct_4_6_f57a9961_for_pre_intra_cla9_B0)((uint)reg->pre_intra_cla9_B0 & 0xfffc0fff);
  reg->pre_intra_cla9_B0 =
       (anon_struct_4_6_f57a9961_for_pre_intra_cla9_B0)((uint)reg->pre_intra_cla9_B0 & 0xff03ffff);
  reg->pre_intra_cla9_B0 =
       (anon_struct_4_6_f57a9961_for_pre_intra_cla9_B0)((uint)reg->pre_intra_cla9_B0 & 0xc0ffffff);
  reg->pre_intra_cla9_B1 =
       (anon_struct_4_6_fe4ba33c_for_pre_intra_cla9_B1)((uint)reg->pre_intra_cla9_B1 & 0xffffffc0);
  reg->pre_intra_cla9_B1 =
       (anon_struct_4_6_fe4ba33c_for_pre_intra_cla9_B1)((uint)reg->pre_intra_cla9_B1 & 0xfffff03f);
  reg->pre_intra_cla9_B1 =
       (anon_struct_4_6_fe4ba33c_for_pre_intra_cla9_B1)((uint)reg->pre_intra_cla9_B1 & 0xfffc0fff);
  reg->pre_intra_cla9_B1 =
       (anon_struct_4_6_fe4ba33c_for_pre_intra_cla9_B1)((uint)reg->pre_intra_cla9_B1 & 0xff03ffff);
  reg->pre_intra_cla9_B1 =
       (anon_struct_4_6_fe4ba33c_for_pre_intra_cla9_B1)((uint)reg->pre_intra_cla9_B1 & 0xc0ffffff);
  reg->pre_intra_cla10_B0 =
       (anon_struct_4_6_ed28447f_for_pre_intra_cla10_B0)((uint)reg->pre_intra_cla10_B0 & 0xffffffc0)
  ;
  reg->pre_intra_cla10_B0 =
       (anon_struct_4_6_ed28447f_for_pre_intra_cla10_B0)((uint)reg->pre_intra_cla10_B0 & 0xfffff03f)
  ;
  reg->pre_intra_cla10_B0 =
       (anon_struct_4_6_ed28447f_for_pre_intra_cla10_B0)((uint)reg->pre_intra_cla10_B0 & 0xfffc0fff)
  ;
  reg->pre_intra_cla10_B0 =
       (anon_struct_4_6_ed28447f_for_pre_intra_cla10_B0)((uint)reg->pre_intra_cla10_B0 & 0xff03ffff)
  ;
  reg->pre_intra_cla10_B0 =
       (anon_struct_4_6_ed28447f_for_pre_intra_cla10_B0)((uint)reg->pre_intra_cla10_B0 & 0xc0ffffff)
  ;
  reg->pre_intra_cla10_B1 =
       (anon_struct_4_6_f5f94e5a_for_pre_intra_cla10_B1)((uint)reg->pre_intra_cla10_B1 & 0xffffffc0)
  ;
  reg->pre_intra_cla10_B1 =
       (anon_struct_4_6_f5f94e5a_for_pre_intra_cla10_B1)((uint)reg->pre_intra_cla10_B1 & 0xfffff03f)
  ;
  reg->pre_intra_cla10_B1 =
       (anon_struct_4_6_f5f94e5a_for_pre_intra_cla10_B1)((uint)reg->pre_intra_cla10_B1 & 0xfffc0fff)
  ;
  reg->pre_intra_cla10_B1 =
       (anon_struct_4_6_f5f94e5a_for_pre_intra_cla10_B1)((uint)reg->pre_intra_cla10_B1 & 0xff03ffff)
  ;
  reg->pre_intra_cla10_B1 =
       (anon_struct_4_6_f5f94e5a_for_pre_intra_cla10_B1)((uint)reg->pre_intra_cla10_B1 & 0xc0ffffff)
  ;
  reg->pre_intra_cla11_B0 =
       (anon_struct_4_6_1ff70bc0_for_pre_intra_cla11_B0)((uint)reg->pre_intra_cla11_B0 & 0xffffffc0)
  ;
  reg->pre_intra_cla11_B0 =
       (anon_struct_4_6_1ff70bc0_for_pre_intra_cla11_B0)((uint)reg->pre_intra_cla11_B0 & 0xfffff03f)
  ;
  reg->pre_intra_cla11_B0 =
       (anon_struct_4_6_1ff70bc0_for_pre_intra_cla11_B0)((uint)reg->pre_intra_cla11_B0 & 0xfffc0fff)
  ;
  reg->pre_intra_cla11_B0 =
       (anon_struct_4_6_1ff70bc0_for_pre_intra_cla11_B0)((uint)reg->pre_intra_cla11_B0 & 0xff03ffff)
  ;
  reg->pre_intra_cla11_B0 =
       (anon_struct_4_6_1ff70bc0_for_pre_intra_cla11_B0)((uint)reg->pre_intra_cla11_B0 & 0xc0ffffff)
  ;
  reg->pre_intra_cla11_B1 =
       (anon_struct_4_6_28c8159b_for_pre_intra_cla11_B1)((uint)reg->pre_intra_cla11_B1 & 0xffffffc0)
  ;
  reg->pre_intra_cla11_B1 =
       (anon_struct_4_6_28c8159b_for_pre_intra_cla11_B1)((uint)reg->pre_intra_cla11_B1 & 0xfffff03f)
  ;
  reg->pre_intra_cla11_B1 =
       (anon_struct_4_6_28c8159b_for_pre_intra_cla11_B1)((uint)reg->pre_intra_cla11_B1 & 0xfffc0fff)
  ;
  reg->pre_intra_cla11_B1 =
       (anon_struct_4_6_28c8159b_for_pre_intra_cla11_B1)((uint)reg->pre_intra_cla11_B1 & 0xff03ffff)
  ;
  reg->pre_intra_cla11_B1 =
       (anon_struct_4_6_28c8159b_for_pre_intra_cla11_B1)((uint)reg->pre_intra_cla11_B1 & 0xc0ffffff)
  ;
  reg->pre_intra_cla12_B0 =
       (anon_struct_4_6_52c5d301_for_pre_intra_cla12_B0)((uint)reg->pre_intra_cla12_B0 & 0xffffffc0)
  ;
  reg->pre_intra_cla12_B0 =
       (anon_struct_4_6_52c5d301_for_pre_intra_cla12_B0)((uint)reg->pre_intra_cla12_B0 & 0xfffff03f)
  ;
  reg->pre_intra_cla12_B0 =
       (anon_struct_4_6_52c5d301_for_pre_intra_cla12_B0)((uint)reg->pre_intra_cla12_B0 & 0xfffc0fff)
  ;
  reg->pre_intra_cla12_B0 =
       (anon_struct_4_6_52c5d301_for_pre_intra_cla12_B0)((uint)reg->pre_intra_cla12_B0 & 0xff03ffff)
  ;
  reg->pre_intra_cla12_B0 =
       (anon_struct_4_6_52c5d301_for_pre_intra_cla12_B0)((uint)reg->pre_intra_cla12_B0 & 0xc0ffffff)
  ;
  reg->pre_intra_cla12_B1 =
       (anon_struct_4_6_5b96dcdc_for_pre_intra_cla12_B1)((uint)reg->pre_intra_cla12_B1 & 0xffffffc0)
  ;
  reg->pre_intra_cla12_B1 =
       (anon_struct_4_6_5b96dcdc_for_pre_intra_cla12_B1)((uint)reg->pre_intra_cla12_B1 & 0xfffff03f)
  ;
  reg->pre_intra_cla12_B1 =
       (anon_struct_4_6_5b96dcdc_for_pre_intra_cla12_B1)((uint)reg->pre_intra_cla12_B1 & 0xfffc0fff)
  ;
  reg->pre_intra_cla12_B1 =
       (anon_struct_4_6_5b96dcdc_for_pre_intra_cla12_B1)((uint)reg->pre_intra_cla12_B1 & 0xff03ffff)
  ;
  reg->pre_intra_cla12_B1 =
       (anon_struct_4_6_5b96dcdc_for_pre_intra_cla12_B1)((uint)reg->pre_intra_cla12_B1 & 0xc0ffffff)
  ;
  reg->pre_intra_cla13_B0 =
       (anon_struct_4_6_85949a42_for_pre_intra_cla13_B0)((uint)reg->pre_intra_cla13_B0 & 0xffffffc0)
  ;
  reg->pre_intra_cla13_B0 =
       (anon_struct_4_6_85949a42_for_pre_intra_cla13_B0)((uint)reg->pre_intra_cla13_B0 & 0xfffff03f)
  ;
  reg->pre_intra_cla13_B0 =
       (anon_struct_4_6_85949a42_for_pre_intra_cla13_B0)((uint)reg->pre_intra_cla13_B0 & 0xfffc0fff)
  ;
  reg->pre_intra_cla13_B0 =
       (anon_struct_4_6_85949a42_for_pre_intra_cla13_B0)((uint)reg->pre_intra_cla13_B0 & 0xff03ffff)
  ;
  reg->pre_intra_cla13_B0 =
       (anon_struct_4_6_85949a42_for_pre_intra_cla13_B0)((uint)reg->pre_intra_cla13_B0 & 0xc0ffffff)
  ;
  reg->pre_intra_cla13_B1 =
       (anon_struct_4_6_8e65a41d_for_pre_intra_cla13_B1)((uint)reg->pre_intra_cla13_B1 & 0xffffffc0)
  ;
  reg->pre_intra_cla13_B1 =
       (anon_struct_4_6_8e65a41d_for_pre_intra_cla13_B1)((uint)reg->pre_intra_cla13_B1 & 0xfffff03f)
  ;
  reg->pre_intra_cla13_B1 =
       (anon_struct_4_6_8e65a41d_for_pre_intra_cla13_B1)((uint)reg->pre_intra_cla13_B1 & 0xfffc0fff)
  ;
  reg->pre_intra_cla13_B1 =
       (anon_struct_4_6_8e65a41d_for_pre_intra_cla13_B1)((uint)reg->pre_intra_cla13_B1 & 0xff03ffff)
  ;
  reg->pre_intra_cla13_B1 =
       (anon_struct_4_6_8e65a41d_for_pre_intra_cla13_B1)((uint)reg->pre_intra_cla13_B1 & 0xc0ffffff)
  ;
  reg->pre_intra_cla14_B0 =
       (anon_struct_4_6_b8636183_for_pre_intra_cla14_B0)((uint)reg->pre_intra_cla14_B0 & 0xffffffc0)
  ;
  reg->pre_intra_cla14_B0 =
       (anon_struct_4_6_b8636183_for_pre_intra_cla14_B0)((uint)reg->pre_intra_cla14_B0 & 0xfffff03f)
  ;
  reg->pre_intra_cla14_B0 =
       (anon_struct_4_6_b8636183_for_pre_intra_cla14_B0)((uint)reg->pre_intra_cla14_B0 & 0xfffc0fff)
  ;
  reg->pre_intra_cla14_B0 =
       (anon_struct_4_6_b8636183_for_pre_intra_cla14_B0)((uint)reg->pre_intra_cla14_B0 & 0xff03ffff)
  ;
  reg->pre_intra_cla14_B0 =
       (anon_struct_4_6_b8636183_for_pre_intra_cla14_B0)((uint)reg->pre_intra_cla14_B0 & 0xc0ffffff)
  ;
  reg->pre_intra_cla14_B1 =
       (anon_struct_4_6_c1346b5e_for_pre_intra_cla14_B1)((uint)reg->pre_intra_cla14_B1 & 0xffffffc0)
  ;
  reg->pre_intra_cla14_B1 =
       (anon_struct_4_6_c1346b5e_for_pre_intra_cla14_B1)((uint)reg->pre_intra_cla14_B1 & 0xfffff03f)
  ;
  reg->pre_intra_cla14_B1 =
       (anon_struct_4_6_c1346b5e_for_pre_intra_cla14_B1)((uint)reg->pre_intra_cla14_B1 & 0xfffc0fff)
  ;
  reg->pre_intra_cla14_B1 =
       (anon_struct_4_6_c1346b5e_for_pre_intra_cla14_B1)((uint)reg->pre_intra_cla14_B1 & 0xff03ffff)
  ;
  reg->pre_intra_cla14_B1 =
       (anon_struct_4_6_c1346b5e_for_pre_intra_cla14_B1)((uint)reg->pre_intra_cla14_B1 & 0xc0ffffff)
  ;
  reg->pre_intra_cla15_B0 =
       (anon_struct_4_6_eb3228c4_for_pre_intra_cla15_B0)((uint)reg->pre_intra_cla15_B0 & 0xffffffc0)
  ;
  reg->pre_intra_cla15_B0 =
       (anon_struct_4_6_eb3228c4_for_pre_intra_cla15_B0)((uint)reg->pre_intra_cla15_B0 & 0xfffff03f)
  ;
  reg->pre_intra_cla15_B0 =
       (anon_struct_4_6_eb3228c4_for_pre_intra_cla15_B0)((uint)reg->pre_intra_cla15_B0 & 0xfffc0fff)
  ;
  reg->pre_intra_cla15_B0 =
       (anon_struct_4_6_eb3228c4_for_pre_intra_cla15_B0)((uint)reg->pre_intra_cla15_B0 & 0xff03ffff)
  ;
  reg->pre_intra_cla15_B0 =
       (anon_struct_4_6_eb3228c4_for_pre_intra_cla15_B0)((uint)reg->pre_intra_cla15_B0 & 0xc0ffffff)
  ;
  reg->pre_intra_cla15_B1 =
       (anon_struct_4_6_f403329f_for_pre_intra_cla15_B1)((uint)reg->pre_intra_cla15_B1 & 0xffffffc0)
  ;
  reg->pre_intra_cla15_B1 =
       (anon_struct_4_6_f403329f_for_pre_intra_cla15_B1)((uint)reg->pre_intra_cla15_B1 & 0xfffff03f)
  ;
  reg->pre_intra_cla15_B1 =
       (anon_struct_4_6_f403329f_for_pre_intra_cla15_B1)((uint)reg->pre_intra_cla15_B1 & 0xfffc0fff)
  ;
  reg->pre_intra_cla15_B1 =
       (anon_struct_4_6_f403329f_for_pre_intra_cla15_B1)((uint)reg->pre_intra_cla15_B1 & 0xff03ffff)
  ;
  reg->pre_intra_cla15_B1 =
       (anon_struct_4_6_f403329f_for_pre_intra_cla15_B1)((uint)reg->pre_intra_cla15_B1 & 0xc0ffffff)
  ;
  reg->pre_intra_cla16_B0 =
       (anon_struct_4_6_1e00f005_for_pre_intra_cla16_B0)((uint)reg->pre_intra_cla16_B0 & 0xffffffc0)
  ;
  reg->pre_intra_cla16_B0 =
       (anon_struct_4_6_1e00f005_for_pre_intra_cla16_B0)((uint)reg->pre_intra_cla16_B0 & 0xfffff03f)
  ;
  reg->pre_intra_cla16_B0 =
       (anon_struct_4_6_1e00f005_for_pre_intra_cla16_B0)((uint)reg->pre_intra_cla16_B0 & 0xfffc0fff)
  ;
  reg->pre_intra_cla16_B0 =
       (anon_struct_4_6_1e00f005_for_pre_intra_cla16_B0)((uint)reg->pre_intra_cla16_B0 & 0xff03ffff)
  ;
  reg->pre_intra_cla16_B0 =
       (anon_struct_4_6_1e00f005_for_pre_intra_cla16_B0)((uint)reg->pre_intra_cla16_B0 & 0xc0ffffff)
  ;
  reg->pre_intra_cla16_B1 =
       (anon_struct_4_6_26d1f9e0_for_pre_intra_cla16_B1)((uint)reg->pre_intra_cla16_B1 & 0xffffffc0)
  ;
  reg->pre_intra_cla16_B1 =
       (anon_struct_4_6_26d1f9e0_for_pre_intra_cla16_B1)((uint)reg->pre_intra_cla16_B1 & 0xfffff03f)
  ;
  reg->pre_intra_cla16_B1 =
       (anon_struct_4_6_26d1f9e0_for_pre_intra_cla16_B1)((uint)reg->pre_intra_cla16_B1 & 0xfffc0fff)
  ;
  reg->pre_intra_cla16_B1 =
       (anon_struct_4_6_26d1f9e0_for_pre_intra_cla16_B1)((uint)reg->pre_intra_cla16_B1 & 0xff03ffff)
  ;
  reg->pre_intra_cla16_B1 =
       (anon_struct_4_6_26d1f9e0_for_pre_intra_cla16_B1)((uint)reg->pre_intra_cla16_B1 & 0xc0ffffff)
  ;
  reg->i16_sobel_t_hevc =
       (anon_struct_4_4_c36627e3_for_i16_sobel_t_hevc)
       ((uint)reg->i16_sobel_t_hevc & 0xfffff000 | 0x40);
  reg->i16_sobel_t_hevc =
       (anon_struct_4_4_c36627e3_for_i16_sobel_t_hevc)
       ((uint)reg->i16_sobel_t_hevc & 0xf000ffff | 0xc80000);
  reg->i16_sobel_a_00_hevc =
       (anon_struct_4_6_23b83de7_for_i16_sobel_a_00_hevc)
       ((uint)reg->i16_sobel_a_00_hevc & 0xffffffc0 | 0x20);
  reg->i16_sobel_a_00_hevc =
       (anon_struct_4_6_23b83de7_for_i16_sobel_a_00_hevc)
       ((uint)reg->i16_sobel_a_00_hevc & 0xfffff03f | 0x800);
  reg->i16_sobel_a_00_hevc =
       (anon_struct_4_6_23b83de7_for_i16_sobel_a_00_hevc)
       ((uint)reg->i16_sobel_a_00_hevc & 0xfffc0fff | 0x20000);
  reg->i16_sobel_a_00_hevc =
       (anon_struct_4_6_23b83de7_for_i16_sobel_a_00_hevc)
       ((uint)reg->i16_sobel_a_00_hevc & 0xff03ffff | 0x800000);
  reg->i16_sobel_a_00_hevc =
       (anon_struct_4_6_23b83de7_for_i16_sobel_a_00_hevc)
       ((uint)reg->i16_sobel_a_00_hevc & 0xc0ffffff | 0x20000000);
  reg->i16_sobel_a_01_hevc =
       (anon_struct_4_5_39d283e6_for_i16_sobel_a_01_hevc)
       ((uint)reg->i16_sobel_a_01_hevc & 0xffffffc0 | 0x20);
  reg->i16_sobel_a_01_hevc =
       (anon_struct_4_5_39d283e6_for_i16_sobel_a_01_hevc)
       ((uint)reg->i16_sobel_a_01_hevc & 0xfffff03f | 0x800);
  reg->i16_sobel_a_01_hevc =
       (anon_struct_4_5_39d283e6_for_i16_sobel_a_01_hevc)
       ((uint)reg->i16_sobel_a_01_hevc & 0xfffc0fff | 0x20000);
  reg->i16_sobel_a_01_hevc =
       (anon_struct_4_5_39d283e6_for_i16_sobel_a_01_hevc)
       ((uint)reg->i16_sobel_a_01_hevc & 0xff03ffff | 0x800000);
  reg->i16_sobel_b_00_hevc =
       (anon_struct_4_4_14638863_for_i16_sobel_b_00_hevc)
       ((uint)reg->i16_sobel_b_00_hevc & 0xffff8000);
  reg->i16_sobel_b_00_hevc =
       (anon_struct_4_4_14638863_for_i16_sobel_b_00_hevc)
       ((uint)reg->i16_sobel_b_00_hevc & 0x8000ffff);
  reg->i16_sobel_b_01_hevc =
       (anon_struct_4_4_146478a3_for_i16_sobel_b_01_hevc)
       ((uint)reg->i16_sobel_b_01_hevc & 0xffff8000);
  reg->i16_sobel_b_01_hevc =
       (anon_struct_4_4_146478a3_for_i16_sobel_b_01_hevc)
       ((uint)reg->i16_sobel_b_01_hevc & 0x8000ffff);
  reg->i16_sobel_b_02_hevc =
       (anon_struct_4_4_146568e3_for_i16_sobel_b_02_hevc)
       ((uint)reg->i16_sobel_b_02_hevc & 0xffff8000);
  reg->i16_sobel_b_02_hevc =
       (anon_struct_4_4_146568e3_for_i16_sobel_b_02_hevc)
       ((uint)reg->i16_sobel_b_02_hevc & 0x8000ffff);
  reg->i16_sobel_b_03_hevc =
       (anon_struct_4_4_14665923_for_i16_sobel_b_03_hevc)
       ((uint)reg->i16_sobel_b_03_hevc & 0xffff8000);
  reg->i16_sobel_b_03_hevc =
       (anon_struct_4_4_14665923_for_i16_sobel_b_03_hevc)
       ((uint)reg->i16_sobel_b_03_hevc & 0x8000ffff);
  reg->i16_sobel_b_04_hevc =
       (anon_struct_4_2_98513e62_for_i16_sobel_b_04_hevc)
       ((uint)reg->i16_sobel_b_04_hevc & 0xffff8000);
  reg->i16_sobel_c_00_hevc =
       (anon_struct_4_6_982c33e9_for_i16_sobel_c_00_hevc)
       ((uint)reg->i16_sobel_c_00_hevc & 0xffffffc0 | 0xd);
  reg->i16_sobel_c_00_hevc =
       (anon_struct_4_6_982c33e9_for_i16_sobel_c_00_hevc)
       ((uint)reg->i16_sobel_c_00_hevc & 0xfffff03f | 0x340);
  reg->i16_sobel_c_00_hevc =
       (anon_struct_4_6_982c33e9_for_i16_sobel_c_00_hevc)
       ((uint)reg->i16_sobel_c_00_hevc & 0xfffc0fff | 0xd000);
  reg->i16_sobel_c_00_hevc =
       (anon_struct_4_6_982c33e9_for_i16_sobel_c_00_hevc)
       ((uint)reg->i16_sobel_c_00_hevc & 0xff03ffff | 0x340000);
  reg->i16_sobel_c_00_hevc =
       (anon_struct_4_6_982c33e9_for_i16_sobel_c_00_hevc)
       ((uint)reg->i16_sobel_c_00_hevc & 0xc0ffffff | 0xd000000);
  reg->i16_sobel_c_01_hevc =
       (anon_struct_4_5_847d1466_for_i16_sobel_c_01_hevc)
       ((uint)reg->i16_sobel_c_01_hevc & 0xffffffc0 | 0xd);
  reg->i16_sobel_c_01_hevc =
       (anon_struct_4_5_847d1466_for_i16_sobel_c_01_hevc)
       ((uint)reg->i16_sobel_c_01_hevc & 0xfffff03f | 0x340);
  reg->i16_sobel_c_01_hevc =
       (anon_struct_4_5_847d1466_for_i16_sobel_c_01_hevc)
       ((uint)reg->i16_sobel_c_01_hevc & 0xfffc0fff | 0xd000);
  reg->i16_sobel_c_01_hevc =
       (anon_struct_4_5_847d1466_for_i16_sobel_c_01_hevc)
       ((uint)reg->i16_sobel_c_01_hevc & 0xff03ffff | 0x340000);
  reg->i16_sobel_d_00_hevc =
       (anon_struct_4_4_0caec023_for_i16_sobel_d_00_hevc)
       ((uint)reg->i16_sobel_d_00_hevc & 0xffff8000 | 0x5cc6);
  reg->i16_sobel_d_00_hevc =
       (anon_struct_4_4_0caec023_for_i16_sobel_d_00_hevc)
       ((uint)reg->i16_sobel_d_00_hevc & 0x8000ffff | 0x5cc60000);
  reg->i16_sobel_d_01_hevc =
       (anon_struct_4_4_0cafb063_for_i16_sobel_d_01_hevc)
       ((uint)reg->i16_sobel_d_01_hevc & 0xffff8000 | 0x5cc6);
  reg->i16_sobel_d_01_hevc =
       (anon_struct_4_4_0cafb063_for_i16_sobel_d_01_hevc)
       ((uint)reg->i16_sobel_d_01_hevc & 0x8000ffff | 0x5cc60000);
  reg->i16_sobel_d_02_hevc =
       (anon_struct_4_4_0cb0a0a3_for_i16_sobel_d_02_hevc)
       ((uint)reg->i16_sobel_d_02_hevc & 0xffff8000 | 0x5cc6);
  reg->i16_sobel_d_02_hevc =
       (anon_struct_4_4_0cb0a0a3_for_i16_sobel_d_02_hevc)
       ((uint)reg->i16_sobel_d_02_hevc & 0x8000ffff | 0x5cc60000);
  reg->i16_sobel_d_03_hevc =
       (anon_struct_4_4_0cb190e3_for_i16_sobel_d_03_hevc)
       ((uint)reg->i16_sobel_d_03_hevc & 0xffff8000 | 0x5cc6);
  reg->i16_sobel_d_03_hevc =
       (anon_struct_4_4_0cb190e3_for_i16_sobel_d_03_hevc)
       ((uint)reg->i16_sobel_d_03_hevc & 0x8000ffff | 0x5cc60000);
  reg->i16_sobel_d_04_hevc =
       (anon_struct_4_2_021db4e4_for_i16_sobel_d_04_hevc)
       ((uint)reg->i16_sobel_d_04_hevc & 0xffff8000 | 0x5cc6);
  reg->i16_sobel_e_00_17_hevc[0] = 20000;
  reg->i16_sobel_e_00_17_hevc[2] = 20000;
  reg->i16_sobel_e_00_17_hevc[4] = 20000;
  reg->i16_sobel_e_00_17_hevc[6] = 20000;
  reg->i16_sobel_e_00_17_hevc[8] = 20000;
  reg->i16_sobel_e_00_17_hevc[10] = 20000;
  reg->i16_sobel_e_00_17_hevc[0xc] = 20000;
  reg->i16_sobel_e_00_17_hevc[0xe] = 20000;
  reg->i16_sobel_e_00_17_hevc[0x10] = 20000;
  reg->i16_sobel_e_00_17_hevc[1] = 0;
  reg->i16_sobel_e_00_17_hevc[3] = 0;
  reg->i16_sobel_e_00_17_hevc[5] = 0;
  reg->i16_sobel_e_00_17_hevc[7] = 0;
  reg->i16_sobel_e_00_17_hevc[9] = 0;
  reg->i16_sobel_e_00_17_hevc[0xb] = 0;
  reg->i16_sobel_e_00_17_hevc[0xd] = 0;
  reg->i16_sobel_e_00_17_hevc[0xf] = 0;
  reg->i16_sobel_e_00_17_hevc[0x11] = 0;
  reg->i32_sobel_t_00_hevc =
       (anon_struct_4_4_8b5608e3_for_i32_sobel_t_00_hevc)
       ((uint)reg->i32_sobel_t_00_hevc & 0xfffff000 | 0x280);
  reg->i32_sobel_t_00_hevc =
       (anon_struct_4_4_8b5608e3_for_i32_sobel_t_00_hevc)
       ((uint)reg->i32_sobel_t_00_hevc & 0xf000ffff);
  reg->i32_sobel_t_01_hevc =
       (anon_struct_4_2_6d151924_for_i32_sobel_t_01_hevc)
       ((uint)reg->i32_sobel_t_01_hevc & 0xffffffc0 | 8);
  reg->i32_sobel_t_02_hevc =
       (anon_struct_4_4_8b577143_for_i32_sobel_t_02_hevc)
       ((uint)reg->i32_sobel_t_02_hevc & 0xfffff000 | 100);
  reg->i32_sobel_t_02_hevc =
       (anon_struct_4_4_8b577143_for_i32_sobel_t_02_hevc)
       ((uint)reg->i32_sobel_t_02_hevc & 0xf000ffff | 0x640000);
  reg->i32_sobel_a_hevc =
       (anon_struct_4_6_29a86300_for_i32_sobel_a_hevc)
       ((uint)reg->i32_sobel_a_hevc & 0xffffffc0 | 0x12);
  reg->i32_sobel_a_hevc =
       (anon_struct_4_6_29a86300_for_i32_sobel_a_hevc)
       ((uint)reg->i32_sobel_a_hevc & 0xfffff03f | 0x480);
  reg->i32_sobel_a_hevc =
       (anon_struct_4_6_29a86300_for_i32_sobel_a_hevc)
       ((uint)reg->i32_sobel_a_hevc & 0xfffc0fff | 0x12000);
  reg->i32_sobel_a_hevc =
       (anon_struct_4_6_29a86300_for_i32_sobel_a_hevc)
       ((uint)reg->i32_sobel_a_hevc & 0xff03ffff | 0x480000);
  reg->i32_sobel_a_hevc =
       (anon_struct_4_6_29a86300_for_i32_sobel_a_hevc)
       ((uint)reg->i32_sobel_a_hevc & 0xc0ffffff | 0x12000000);
  reg->i32_sobel_b_00_hevc =
       (anon_struct_4_4_12b38143_for_i32_sobel_b_00_hevc)
       ((uint)reg->i32_sobel_b_00_hevc & 0xffff8000);
  reg->i32_sobel_b_00_hevc =
       (anon_struct_4_4_12b38143_for_i32_sobel_b_00_hevc)
       ((uint)reg->i32_sobel_b_00_hevc & 0x8000ffff);
  reg->i32_sobel_b_01_hevc =
       (anon_struct_4_4_12b47183_for_i32_sobel_b_01_hevc)
       ((uint)reg->i32_sobel_b_01_hevc & 0xffff8000);
  reg->i32_sobel_b_01_hevc =
       (anon_struct_4_4_12b47183_for_i32_sobel_b_01_hevc)
       ((uint)reg->i32_sobel_b_01_hevc & 0x8000ffff);
  reg->i32_sobel_b_02_hevc =
       (anon_struct_4_2_f5bc293f_for_i32_sobel_b_02_hevc)
       ((uint)reg->i32_sobel_b_02_hevc & 0xffff8000);
  reg->i32_sobel_c_hevc =
       (anon_struct_4_6_9e1c5902_for_i32_sobel_c_hevc)
       ((uint)reg->i32_sobel_c_hevc & 0xffffffc0 | 0x12);
  reg->i32_sobel_c_hevc =
       (anon_struct_4_6_9e1c5902_for_i32_sobel_c_hevc)
       ((uint)reg->i32_sobel_c_hevc & 0xfffff03f | 0x480);
  reg->i32_sobel_c_hevc =
       (anon_struct_4_6_9e1c5902_for_i32_sobel_c_hevc)
       ((uint)reg->i32_sobel_c_hevc & 0xfffc0fff | 0x12000);
  reg->i32_sobel_c_hevc =
       (anon_struct_4_6_9e1c5902_for_i32_sobel_c_hevc)
       ((uint)reg->i32_sobel_c_hevc & 0xff03ffff | 0x480000);
  reg->i32_sobel_c_hevc =
       (anon_struct_4_6_9e1c5902_for_i32_sobel_c_hevc)
       ((uint)reg->i32_sobel_c_hevc & 0xc0ffffff | 0x12000000);
  reg->i32_sobel_d_00_hevc =
       (anon_struct_4_4_0afeb903_for_i32_sobel_d_00_hevc)
       ((uint)reg->i32_sobel_d_00_hevc & 0xffff8000);
  reg->i32_sobel_d_00_hevc =
       (anon_struct_4_4_0afeb903_for_i32_sobel_d_00_hevc)
       ((uint)reg->i32_sobel_d_00_hevc & 0x8000ffff);
  reg->i32_sobel_d_01_hevc =
       (anon_struct_4_4_0affa943_for_i32_sobel_d_01_hevc)
       ((uint)reg->i32_sobel_d_01_hevc & 0xffff8000);
  reg->i32_sobel_d_01_hevc =
       (anon_struct_4_4_0affa943_for_i32_sobel_d_01_hevc)
       ((uint)reg->i32_sobel_d_01_hevc & 0x8000ffff);
  reg->i32_sobel_d_02_hevc =
       (anon_struct_4_2_5f889fc1_for_i32_sobel_d_02_hevc)
       ((uint)reg->i32_sobel_d_02_hevc & 0xffff8000);
  reg->i32_sobel_e_00_09_hevc[0] = 20000;
  reg->i32_sobel_e_00_09_hevc[2] = 20000;
  reg->i32_sobel_e_00_09_hevc[4] = 20000;
  reg->i32_sobel_e_00_09_hevc[6] = 20000;
  reg->i32_sobel_e_00_09_hevc[8] = 20000;
  reg->i32_sobel_e_00_09_hevc[1] = 0;
  reg->i32_sobel_e_00_09_hevc[3] = 0;
  reg->i32_sobel_e_00_09_hevc[5] = 0;
  reg->i32_sobel_e_00_09_hevc[7] = 0;
  reg->i32_sobel_e_00_09_hevc[9] = 0;
  return;
}

Assistant:

static void vepu540_h265_set_l2_regs(H265eV54xL2RegSet *reg)
{
    reg->pre_intra_cla0_B0.pre_intra_cla0_m0 = 10;
    reg->pre_intra_cla0_B0.pre_intra_cla0_m1 = 11;
    reg->pre_intra_cla0_B0.pre_intra_cla0_m2 = 12;
    reg->pre_intra_cla0_B0.pre_intra_cla0_m3 = 13;
    reg->pre_intra_cla0_B0.pre_intra_cla0_m4 = 14;
    reg->pre_intra_cla0_B1.pre_intra_cla0_m5 = 9;
    reg->pre_intra_cla0_B1.pre_intra_cla0_m6 = 15;
    reg->pre_intra_cla0_B1.pre_intra_cla0_m7 = 8;
    reg->pre_intra_cla0_B1.pre_intra_cla0_m8 = 16;
    reg->pre_intra_cla0_B1.pre_intra_cla0_m9 = 7;

    reg->pre_intra_cla1_B0.pre_intra_cla1_m0 = 10;
    reg->pre_intra_cla1_B0.pre_intra_cla1_m1 = 9;
    reg->pre_intra_cla1_B0.pre_intra_cla1_m2 = 8;
    reg->pre_intra_cla1_B0.pre_intra_cla1_m3 = 7;
    reg->pre_intra_cla1_B0.pre_intra_cla1_m4 = 6;
    reg->pre_intra_cla1_B1.pre_intra_cla1_m5 = 11;
    reg->pre_intra_cla1_B1.pre_intra_cla1_m6 = 5;
    reg->pre_intra_cla1_B1.pre_intra_cla1_m7 = 12;
    reg->pre_intra_cla1_B1.pre_intra_cla1_m8 = 4;
    reg->pre_intra_cla1_B1.pre_intra_cla1_m9 = 13;

    reg->pre_intra_cla2_B0.pre_intra_cla2_m0 = 18;
    reg->pre_intra_cla2_B0.pre_intra_cla2_m1 = 17;
    reg->pre_intra_cla2_B0.pre_intra_cla2_m2 = 16;
    reg->pre_intra_cla2_B0.pre_intra_cla2_m3 = 15;
    reg->pre_intra_cla2_B0.pre_intra_cla2_m4 = 14;
    reg->pre_intra_cla2_B1.pre_intra_cla2_m5 = 19;
    reg->pre_intra_cla2_B1.pre_intra_cla2_m6 = 13;
    reg->pre_intra_cla2_B1.pre_intra_cla2_m7 = 20;
    reg->pre_intra_cla2_B1.pre_intra_cla2_m8 = 12;
    reg->pre_intra_cla2_B1.pre_intra_cla2_m9 = 21;

    reg->pre_intra_cla3_B0.pre_intra_cla3_m0 = 18;
    reg->pre_intra_cla3_B0.pre_intra_cla3_m1 = 19;
    reg->pre_intra_cla3_B0.pre_intra_cla3_m2 = 20;
    reg->pre_intra_cla3_B0.pre_intra_cla3_m3 = 21;
    reg->pre_intra_cla3_B0.pre_intra_cla3_m4 = 22;
    reg->pre_intra_cla3_B1.pre_intra_cla3_m5 = 17;
    reg->pre_intra_cla3_B1.pre_intra_cla3_m6 = 23;
    reg->pre_intra_cla3_B1.pre_intra_cla3_m7 = 16;
    reg->pre_intra_cla3_B1.pre_intra_cla3_m8 = 24;
    reg->pre_intra_cla3_B1.pre_intra_cla3_m9 = 15;

    reg->pre_intra_cla4_B0.pre_intra_cla4_m0 = 25;
    reg->pre_intra_cla4_B0.pre_intra_cla4_m1 = 26;
    reg->pre_intra_cla4_B0.pre_intra_cla4_m2 = 24;
    reg->pre_intra_cla4_B0.pre_intra_cla4_m3 = 23;
    reg->pre_intra_cla4_B0.pre_intra_cla4_m4 = 22;
    reg->pre_intra_cla4_B1.pre_intra_cla4_m5 = 27;
    reg->pre_intra_cla4_B1.pre_intra_cla4_m6 = 21;
    reg->pre_intra_cla4_B1.pre_intra_cla4_m7 = 28;
    reg->pre_intra_cla4_B1.pre_intra_cla4_m8 = 20;
    reg->pre_intra_cla4_B1.pre_intra_cla4_m9 = 29;
    ;
    reg->pre_intra_cla5_B0.pre_intra_cla5_m0 = 27;
    reg->pre_intra_cla5_B0.pre_intra_cla5_m1 = 26;
    reg->pre_intra_cla5_B0.pre_intra_cla5_m2 = 28;
    reg->pre_intra_cla5_B0.pre_intra_cla5_m3 = 29;
    reg->pre_intra_cla5_B0.pre_intra_cla5_m4 = 30;
    reg->pre_intra_cla5_B1.pre_intra_cla5_m5 = 25;
    reg->pre_intra_cla5_B1.pre_intra_cla5_m6 = 31;
    reg->pre_intra_cla5_B1.pre_intra_cla5_m7 = 24;
    reg->pre_intra_cla5_B1.pre_intra_cla5_m8 = 32;
    reg->pre_intra_cla5_B1.pre_intra_cla5_m9 = 23;
    ;
    reg->pre_intra_cla6_B0.pre_intra_cla6_m0 = 34;
    reg->pre_intra_cla6_B0.pre_intra_cla6_m1 = 33;
    reg->pre_intra_cla6_B0.pre_intra_cla6_m2 = 32;
    reg->pre_intra_cla6_B0.pre_intra_cla6_m3 = 31;
    reg->pre_intra_cla6_B0.pre_intra_cla6_m4 = 30;
    reg->pre_intra_cla6_B1.pre_intra_cla6_m5 = 2 ;
    reg->pre_intra_cla6_B1.pre_intra_cla6_m6 = 29;
    reg->pre_intra_cla6_B1.pre_intra_cla6_m7 = 3 ;
    reg->pre_intra_cla6_B1.pre_intra_cla6_m8 = 28;
    reg->pre_intra_cla6_B1.pre_intra_cla6_m9 = 4 ;
    ;
    reg->pre_intra_cla7_B0.pre_intra_cla7_m0 = 34;
    reg->pre_intra_cla7_B0.pre_intra_cla7_m1 = 2 ;
    reg->pre_intra_cla7_B0.pre_intra_cla7_m2 = 3 ;
    reg->pre_intra_cla7_B0.pre_intra_cla7_m3 = 4 ;
    reg->pre_intra_cla7_B0.pre_intra_cla7_m4 = 5 ;
    reg->pre_intra_cla7_B1.pre_intra_cla7_m5 = 33;
    reg->pre_intra_cla7_B1.pre_intra_cla7_m6 = 6 ;
    reg->pre_intra_cla7_B1.pre_intra_cla7_m7 = 32;
    reg->pre_intra_cla7_B1.pre_intra_cla7_m8 = 7 ;
    reg->pre_intra_cla7_B1.pre_intra_cla7_m9 = 31;
    ;
    reg->pre_intra_cla8_B0.pre_intra_cla8_m0 = 10;
    reg->pre_intra_cla8_B0.pre_intra_cla8_m1 = 26;
    reg->pre_intra_cla8_B0.pre_intra_cla8_m2 = 18;
    reg->pre_intra_cla8_B0.pre_intra_cla8_m3 = 34;
    reg->pre_intra_cla8_B0.pre_intra_cla8_m4 = 6 ;
    reg->pre_intra_cla8_B1.pre_intra_cla8_m5 = 14;
    reg->pre_intra_cla8_B1.pre_intra_cla8_m6 = 22;
    reg->pre_intra_cla8_B1.pre_intra_cla8_m7 = 30;
    reg->pre_intra_cla8_B1.pre_intra_cla8_m8 = 2 ;
    reg->pre_intra_cla8_B1.pre_intra_cla8_m9 = 24;
    ;
    reg->pre_intra_cla9_B0.pre_intra_cla9_m0 = 0 ;
    reg->pre_intra_cla9_B0.pre_intra_cla9_m1 = 0 ;
    reg->pre_intra_cla9_B0.pre_intra_cla9_m2 = 0 ;
    reg->pre_intra_cla9_B0.pre_intra_cla9_m3 = 0 ;
    reg->pre_intra_cla9_B0.pre_intra_cla9_m4 = 0 ;
    reg->pre_intra_cla9_B1.pre_intra_cla9_m5 = 0 ;
    reg->pre_intra_cla9_B1.pre_intra_cla9_m6 = 0 ;
    reg->pre_intra_cla9_B1.pre_intra_cla9_m7 = 0 ;
    reg->pre_intra_cla9_B1.pre_intra_cla9_m8 = 0 ;
    reg->pre_intra_cla9_B1.pre_intra_cla9_m9 = 0 ;

    reg->pre_intra_cla10_B0.pre_intra_cla10_m0 =  0;
    reg->pre_intra_cla10_B0.pre_intra_cla10_m1 =  0;
    reg->pre_intra_cla10_B0.pre_intra_cla10_m2 =  0;
    reg->pre_intra_cla10_B0.pre_intra_cla10_m3 =  0;
    reg->pre_intra_cla10_B0.pre_intra_cla10_m4 =  0;
    reg->pre_intra_cla10_B1.pre_intra_cla10_m5 =  0;
    reg->pre_intra_cla10_B1.pre_intra_cla10_m6 =  0;
    reg->pre_intra_cla10_B1.pre_intra_cla10_m7 =  0;
    reg->pre_intra_cla10_B1.pre_intra_cla10_m8 =  0;
    reg->pre_intra_cla10_B1.pre_intra_cla10_m9 =  0;

    reg->pre_intra_cla11_B0.pre_intra_cla11_m0 =  0;
    reg->pre_intra_cla11_B0.pre_intra_cla11_m1 =  0;
    reg->pre_intra_cla11_B0.pre_intra_cla11_m2 =  0;
    reg->pre_intra_cla11_B0.pre_intra_cla11_m3 =  0;
    reg->pre_intra_cla11_B0.pre_intra_cla11_m4 =  0;
    reg->pre_intra_cla11_B1.pre_intra_cla11_m5 =  0;
    reg->pre_intra_cla11_B1.pre_intra_cla11_m6 =  0;
    reg->pre_intra_cla11_B1.pre_intra_cla11_m7 =  0;
    reg->pre_intra_cla11_B1.pre_intra_cla11_m8 =  0;
    reg->pre_intra_cla11_B1.pre_intra_cla11_m9 =  0;

    reg->pre_intra_cla12_B0.pre_intra_cla12_m0 =  0;
    reg->pre_intra_cla12_B0.pre_intra_cla12_m1 =  0;
    reg->pre_intra_cla12_B0.pre_intra_cla12_m2 =  0;
    reg->pre_intra_cla12_B0.pre_intra_cla12_m3 =  0;
    reg->pre_intra_cla12_B0.pre_intra_cla12_m4 =  0;
    reg->pre_intra_cla12_B1.pre_intra_cla12_m5 =  0;
    reg->pre_intra_cla12_B1.pre_intra_cla12_m6 =  0;
    reg->pre_intra_cla12_B1.pre_intra_cla12_m7 =  0;
    reg->pre_intra_cla12_B1.pre_intra_cla12_m8 =  0;
    reg->pre_intra_cla12_B1.pre_intra_cla12_m9 =  0;

    reg->pre_intra_cla13_B0.pre_intra_cla13_m0 =  0;
    reg->pre_intra_cla13_B0.pre_intra_cla13_m1 =  0;
    reg->pre_intra_cla13_B0.pre_intra_cla13_m2 =  0;
    reg->pre_intra_cla13_B0.pre_intra_cla13_m3 =  0;
    reg->pre_intra_cla13_B0.pre_intra_cla13_m4 =  0;
    reg->pre_intra_cla13_B1.pre_intra_cla13_m5 =  0;
    reg->pre_intra_cla13_B1.pre_intra_cla13_m6 =  0;
    reg->pre_intra_cla13_B1.pre_intra_cla13_m7 =  0;
    reg->pre_intra_cla13_B1.pre_intra_cla13_m8 =  0;
    reg->pre_intra_cla13_B1.pre_intra_cla13_m9 =  0;

    reg->pre_intra_cla14_B0.pre_intra_cla14_m0 =  0;
    reg->pre_intra_cla14_B0.pre_intra_cla14_m1 =  0;
    reg->pre_intra_cla14_B0.pre_intra_cla14_m2 =  0;
    reg->pre_intra_cla14_B0.pre_intra_cla14_m3 =  0;
    reg->pre_intra_cla14_B0.pre_intra_cla14_m4 =  0;
    reg->pre_intra_cla14_B1.pre_intra_cla14_m5 =  0;
    reg->pre_intra_cla14_B1.pre_intra_cla14_m6 =  0;
    reg->pre_intra_cla14_B1.pre_intra_cla14_m7 =  0;
    reg->pre_intra_cla14_B1.pre_intra_cla14_m8 =  0;
    reg->pre_intra_cla14_B1.pre_intra_cla14_m9 =  0;

    reg->pre_intra_cla15_B0.pre_intra_cla15_m0 =  0;
    reg->pre_intra_cla15_B0.pre_intra_cla15_m1 =  0;
    reg->pre_intra_cla15_B0.pre_intra_cla15_m2 =  0;
    reg->pre_intra_cla15_B0.pre_intra_cla15_m3 =  0;
    reg->pre_intra_cla15_B0.pre_intra_cla15_m4 =  0;
    reg->pre_intra_cla15_B1.pre_intra_cla15_m5 =  0;
    reg->pre_intra_cla15_B1.pre_intra_cla15_m6 =  0;
    reg->pre_intra_cla15_B1.pre_intra_cla15_m7 =  0;
    reg->pre_intra_cla15_B1.pre_intra_cla15_m8 =  0;
    reg->pre_intra_cla15_B1.pre_intra_cla15_m9 =  0;

    reg->pre_intra_cla16_B0.pre_intra_cla16_m0 =  0;
    reg->pre_intra_cla16_B0.pre_intra_cla16_m1 =  0;
    reg->pre_intra_cla16_B0.pre_intra_cla16_m2 =  0;
    reg->pre_intra_cla16_B0.pre_intra_cla16_m3 =  0;
    reg->pre_intra_cla16_B0.pre_intra_cla16_m4 =  0;
    reg->pre_intra_cla16_B1.pre_intra_cla16_m5 =  0;
    reg->pre_intra_cla16_B1.pre_intra_cla16_m6 =  0;
    reg->pre_intra_cla16_B1.pre_intra_cla16_m7 =  0;
    reg->pre_intra_cla16_B1.pre_intra_cla16_m8 =  0;
    reg->pre_intra_cla16_B1.pre_intra_cla16_m9 =  0;

    reg->i16_sobel_t_hevc.intra_l16_sobel_t0 = 64 ;
    reg->i16_sobel_t_hevc.intra_l16_sobel_t1 = 200;
    reg->i16_sobel_a_00_hevc.intra_l16_sobel_a0_qp0 = 32 ;
    reg->i16_sobel_a_00_hevc.intra_l16_sobel_a0_qp1 = 32 ;
    reg->i16_sobel_a_00_hevc.intra_l16_sobel_a0_qp2 = 32 ;
    reg->i16_sobel_a_00_hevc.intra_l16_sobel_a0_qp3 = 32 ;
    reg->i16_sobel_a_00_hevc.intra_l16_sobel_a0_qp4 = 32 ;
    reg->i16_sobel_a_01_hevc.intra_l16_sobel_a0_qp5 = 32 ;
    reg->i16_sobel_a_01_hevc.intra_l16_sobel_a0_qp6 = 32 ;
    reg->i16_sobel_a_01_hevc.intra_l16_sobel_a0_qp7 = 32 ;
    reg->i16_sobel_a_01_hevc.intra_l16_sobel_a0_qp8 = 32 ;
    reg->i16_sobel_b_00_hevc.intra_l16_sobel_b0_qp0 =  0 ;
    reg->i16_sobel_b_00_hevc.intra_l16_sobel_b0_qp1 =  0 ;
    reg->i16_sobel_b_01_hevc.intra_l16_sobel_b0_qp2 =  0 ;
    reg->i16_sobel_b_01_hevc.intra_l16_sobel_b0_qp3 =  0 ;
    reg->i16_sobel_b_02_hevc.intra_l16_sobel_b0_qp4 =  0 ;
    reg->i16_sobel_b_02_hevc.intra_l16_sobel_b0_qp5 =  0 ;
    reg->i16_sobel_b_03_hevc.intra_l16_sobel_b0_qp6 =  0 ;
    reg->i16_sobel_b_03_hevc.intra_l16_sobel_b0_qp7 =  0 ;
    reg->i16_sobel_b_04_hevc.intra_l16_sobel_b0_qp8 =  0 ;
    reg->i16_sobel_c_00_hevc.intra_l16_sobel_c0_qp0 = 13;
    reg->i16_sobel_c_00_hevc.intra_l16_sobel_c0_qp1 = 13;
    reg->i16_sobel_c_00_hevc.intra_l16_sobel_c0_qp2 = 13;
    reg->i16_sobel_c_00_hevc.intra_l16_sobel_c0_qp3 = 13;
    reg->i16_sobel_c_00_hevc.intra_l16_sobel_c0_qp4 = 13;
    reg->i16_sobel_c_01_hevc.intra_l16_sobel_c0_qp5 = 13;
    reg->i16_sobel_c_01_hevc.intra_l16_sobel_c0_qp6 = 13;
    reg->i16_sobel_c_01_hevc.intra_l16_sobel_c0_qp7 = 13;
    reg->i16_sobel_c_01_hevc.intra_l16_sobel_c0_qp8 = 13;
    reg->i16_sobel_d_00_hevc.intra_l16_sobel_d0_qp0 =  23750;
    reg->i16_sobel_d_00_hevc.intra_l16_sobel_d0_qp1 =  23750;
    reg->i16_sobel_d_01_hevc.intra_l16_sobel_d0_qp2 =  23750;
    reg->i16_sobel_d_01_hevc.intra_l16_sobel_d0_qp3 =  23750;
    reg->i16_sobel_d_02_hevc.intra_l16_sobel_d0_qp4 =  23750;
    reg->i16_sobel_d_02_hevc.intra_l16_sobel_d0_qp5 =  23750;
    reg->i16_sobel_d_03_hevc.intra_l16_sobel_d0_qp6 =  23750;
    reg->i16_sobel_d_03_hevc.intra_l16_sobel_d0_qp7 =  23750;
    reg->i16_sobel_d_04_hevc.intra_l16_sobel_d0_qp8 =  23750;

    reg->i16_sobel_e_00_17_hevc[0]  = 20000;
    reg->i16_sobel_e_00_17_hevc[2]  = 20000;
    reg->i16_sobel_e_00_17_hevc[4]  = 20000;
    reg->i16_sobel_e_00_17_hevc[6]  = 20000;
    reg->i16_sobel_e_00_17_hevc[8]  = 20000;
    reg->i16_sobel_e_00_17_hevc[10] = 20000;
    reg->i16_sobel_e_00_17_hevc[12] = 20000;
    reg->i16_sobel_e_00_17_hevc[14] = 20000;
    reg->i16_sobel_e_00_17_hevc[16] = 20000;
    reg->i16_sobel_e_00_17_hevc[1]  =  0;
    reg->i16_sobel_e_00_17_hevc[3]  =  0;
    reg->i16_sobel_e_00_17_hevc[5]  =  0;
    reg->i16_sobel_e_00_17_hevc[7]  =  0;
    reg->i16_sobel_e_00_17_hevc[9]  =  0;
    reg->i16_sobel_e_00_17_hevc[11] =  0;
    reg->i16_sobel_e_00_17_hevc[13] =  0;
    reg->i16_sobel_e_00_17_hevc[15] =  0;
    reg->i16_sobel_e_00_17_hevc[17] =  0;

    reg->i32_sobel_t_00_hevc.intra_l32_sobel_t2 = 640 ;
    reg->i32_sobel_t_00_hevc.intra_l32_sobel_t3 = 0  ;
    reg->i32_sobel_t_01_hevc.intra_l32_sobel_t4 = 8  ;
    reg->i32_sobel_t_02_hevc.intra_l32_sobel_t5 = 100 ;
    reg->i32_sobel_t_02_hevc.intra_l32_sobel_t6 = 100 ;

    reg->i32_sobel_a_hevc.intra_l32_sobel_a1_qp0 =  18;
    reg->i32_sobel_a_hevc.intra_l32_sobel_a1_qp1 =  18;
    reg->i32_sobel_a_hevc.intra_l32_sobel_a1_qp2 =  18;
    reg->i32_sobel_a_hevc.intra_l32_sobel_a1_qp3 =  18;
    reg->i32_sobel_a_hevc.intra_l32_sobel_a1_qp4 =  18;

    reg->i32_sobel_b_00_hevc.intra_l32_sobel_b1_qp0 =  0;
    reg->i32_sobel_b_00_hevc.intra_l32_sobel_b1_qp1 =  0;
    reg->i32_sobel_b_01_hevc.intra_l32_sobel_b1_qp2 =  0;
    reg->i32_sobel_b_01_hevc.intra_l32_sobel_b1_qp3 =  0;
    reg->i32_sobel_b_02_hevc.intra_l32_sobel_b1_qp4 =  0;

    reg->i32_sobel_c_hevc.intra_l32_sobel_c1_qp0 = 18;
    reg->i32_sobel_c_hevc.intra_l32_sobel_c1_qp1 = 18;
    reg->i32_sobel_c_hevc.intra_l32_sobel_c1_qp2 = 18;
    reg->i32_sobel_c_hevc.intra_l32_sobel_c1_qp3 = 18;
    reg->i32_sobel_c_hevc.intra_l32_sobel_c1_qp4 = 18;

    reg->i32_sobel_d_00_hevc.intra_l32_sobel_d1_qp0 =  0;
    reg->i32_sobel_d_00_hevc.intra_l32_sobel_d1_qp1 =  0;
    reg->i32_sobel_d_01_hevc.intra_l32_sobel_d1_qp2 =  0;
    reg->i32_sobel_d_01_hevc.intra_l32_sobel_d1_qp3 =  0;
    reg->i32_sobel_d_02_hevc.intra_l32_sobel_d1_qp4 =  0;

    reg->i32_sobel_e_00_09_hevc[0] =  20000;
    reg->i32_sobel_e_00_09_hevc[2] =  20000;
    reg->i32_sobel_e_00_09_hevc[4] =  20000;
    reg->i32_sobel_e_00_09_hevc[6] =  20000;
    reg->i32_sobel_e_00_09_hevc[8] =  20000;

    reg->i32_sobel_e_00_09_hevc[1] =  0;
    reg->i32_sobel_e_00_09_hevc[3] =  0;
    reg->i32_sobel_e_00_09_hevc[5] =  0;
    reg->i32_sobel_e_00_09_hevc[7] =  0;
    reg->i32_sobel_e_00_09_hevc[9] =  0;
}